

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::SetUpMarkers(ChLinkLock *this,ChMarker *mark1,ChMarker *mark2)

{
  ChBodyFrame *pCVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  ChLinkMarkers::SetUpMarkers(&this->super_ChLinkMarkers,mark1,mark2);
  pCVar1 = (this->super_ChLinkMarkers).super_ChLink.Body1;
  if ((pCVar1 != (ChBodyFrame *)0x0) &&
     ((this->super_ChLinkMarkers).super_ChLink.Body2 != (ChBodyFrame *)0x0)) {
    iVar2 = (*(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    iVar3 = (*(((this->super_ChLinkMarkers).super_ChLink.Body2)->super_ChFrameMoving<double>).
              super_ChFrame<double>._vptr_ChFrame[0x10])();
    ChLinkMask::SetTwoBodiesVariables
              (&(this->mask).super_ChLinkMask,(ChVariables *)CONCAT44(extraout_var,iVar2),
               (ChVariables *)CONCAT44(extraout_var_00,iVar3));
    BuildLink(this);
    return;
  }
  __assert_fail("this->Body1 && this->Body2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkLock.cpp"
                ,0xf0,"virtual void chrono::ChLinkLock::SetUpMarkers(ChMarker *, ChMarker *)");
}

Assistant:

void ChLinkLock::SetUpMarkers(ChMarker* mark1, ChMarker* mark2) {
    ChLinkMarkers::SetUpMarkers(mark1, mark2);
    assert(this->Body1 && this->Body2);

    mask.SetTwoBodiesVariables(&Body1->Variables(), &Body2->Variables());

    // We must call BuildLink here again, because only now are the constraints properly activated
    // (and hence the correct NDOC available).
    BuildLink();
}